

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_flags_decoder.c
# Opt level: O0

lzma_ret lzma_filter_flags_decode
                   (lzma_filter *filter,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                   size_t in_size)

{
  lzma_ret ret;
  lzma_ret ret__1;
  lzma_vli props_size;
  size_t sStack_38;
  lzma_ret ret_;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_filter *filter_local;
  
  filter->options = (void *)0x0;
  sStack_38 = in_size;
  in_size_local = (size_t)in_pos;
  in_pos_local = (size_t *)in;
  in_local = (uint8_t *)allocator;
  allocator_local = (lzma_allocator *)filter;
  props_size._4_4_ = lzma_vli_decode(&filter->id,(size_t *)0x0,in,in_pos,in_size);
  filter_local._4_4_ = props_size._4_4_;
  if (props_size._4_4_ == LZMA_OK) {
    if (allocator_local->alloc < (_func_void_ptr_void_ptr_size_t_size_t *)0x4000000000000000) {
      filter_local._4_4_ =
           lzma_vli_decode((lzma_vli *)&ret,(size_t *)0x0,(uint8_t *)in_pos_local,
                           (size_t *)in_size_local,sStack_38);
      if (filter_local._4_4_ == LZMA_OK) {
        if (sStack_38 - *(long *)in_size_local < _ret) {
          filter_local._4_4_ = LZMA_DATA_ERROR;
        }
        else {
          filter_local._4_4_ =
               lzma_properties_decode
                         ((lzma_filter *)allocator_local,(lzma_allocator *)in_local,
                          (uint8_t *)((long)in_pos_local + *(long *)in_size_local),_ret);
          *(ulong *)in_size_local = _ret + *(long *)in_size_local;
        }
      }
    }
    else {
      filter_local._4_4_ = LZMA_DATA_ERROR;
    }
  }
  return filter_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filter_flags_decode(
		lzma_filter *filter, const lzma_allocator *allocator,
		const uint8_t *in, size_t *in_pos, size_t in_size)
{
	// Set the pointer to NULL so the caller can always safely free it.
	filter->options = NULL;

	// Filter ID
	return_if_error(lzma_vli_decode(&filter->id, NULL,
			in, in_pos, in_size));

	if (filter->id >= LZMA_FILTER_RESERVED_START)
		return LZMA_DATA_ERROR;

	// Size of Properties
	lzma_vli props_size;
	return_if_error(lzma_vli_decode(&props_size, NULL,
			in, in_pos, in_size));

	// Filter Properties
	if (in_size - *in_pos < props_size)
		return LZMA_DATA_ERROR;

	const lzma_ret ret = lzma_properties_decode(
			filter, allocator, in + *in_pos, props_size);

	*in_pos += props_size;

	return ret;
}